

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv_fs_scandir_next(uv_fs_t *req,uv_dirent_t *ent)

{
  uint uVar1;
  void *__ptr;
  uv__dirent_t *dent;
  uv_dirent_type_t uVar2;
  long lVar3;
  
  lVar3 = req->result;
  if (-1 < lVar3) {
    __ptr = req->ptr;
    lVar3 = 0xfffff001;
    if (__ptr != (void *)0x0) {
      if (req->nbufs != 0) {
        free(*(void **)((long)__ptr + (ulong)(req->nbufs - 1) * 8));
      }
      uVar1 = req->nbufs;
      if (uVar1 == (uint)req->result) {
        free(__ptr);
        req->ptr = (void *)0x0;
      }
      else {
        req->nbufs = uVar1 + 1;
        dent = *(uv__dirent_t **)((long)__ptr + (ulong)uVar1 * 8);
        ent->name = dent->d_name;
        uVar2 = uv__fs_get_dirent_type(dent);
        ent->type = uVar2;
        lVar3 = 0;
      }
    }
  }
  return (int)lVar3;
}

Assistant:

int uv_fs_scandir_next(uv_fs_t* req, uv_dirent_t* ent) {
  uv__dirent_t** dents;
  uv__dirent_t* dent;
  unsigned int* nbufs;

  /* Check to see if req passed */
  if (req->result < 0)
    return req->result;

  /* Ptr will be null if req was canceled or no files found */
  if (!req->ptr)
    return UV_EOF;

  nbufs = uv__get_nbufs(req);
  assert(nbufs);

  dents = req->ptr;

  /* Free previous entity */
  if (*nbufs > 0)
    uv__fs_scandir_free(dents[*nbufs - 1]);

  /* End was already reached */
  if (*nbufs == (unsigned int) req->result) {
    uv__fs_scandir_free(dents);
    req->ptr = NULL;
    return UV_EOF;
  }

  dent = dents[(*nbufs)++];

  ent->name = dent->d_name;
  ent->type = uv__fs_get_dirent_type(dent);

  return 0;
}